

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O2

void * mi_heap_malloc_zero_aligned_at_overalloc
                 (mi_heap_t *heap,size_t size,size_t alignment,size_t offset,_Bool zero)

{
  byte *pbVar1;
  mi_block_t *block;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if (alignment < 0x1000001) {
    sVar2 = 0x10;
    if (0x10 < size) {
      sVar2 = size;
    }
    block = (mi_block_t *)_mi_heap_malloc_zero(heap,(alignment + sVar2) - 1,zero);
    if (block == (mi_block_t *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    if (offset != 0) {
      return (void *)0x0;
    }
    sVar2 = 0x401;
    if (0x401 < size) {
      sVar2 = size;
    }
    block = (mi_block_t *)_mi_heap_malloc_zero_ex(heap,sVar2,false,alignment);
    if (block == (mi_block_t *)0x0) {
      return (void *)0x0;
    }
  }
  uVar7 = (long)&block->next + offset & alignment - 1;
  lVar6 = alignment - uVar7;
  if (uVar7 == 0) {
    lVar6 = 0;
  }
  pvVar3 = (void *)((long)&block->next + lVar6);
  if (lVar6 != 0) {
    uVar4 = (ulong)((long)&block[-1].next + 7U) & 0xfffffffffe000000;
    uVar7 = 0;
    if (0 < (long)uVar4) {
      uVar7 = uVar4;
    }
    lVar5 = ((long)block - uVar7 >> 0x10) * 0x60;
    lVar5 = (uVar7 + lVar5) - (ulong)*(uint *)(uVar7 + 0x124 + lVar5);
    pbVar1 = (byte *)(lVar5 + 0x12e);
    *pbVar1 = *pbVar1 | 2;
    _mi_padding_shrink((mi_page_t *)(lVar5 + 0x120),block,lVar6 + size);
  }
  if (zero && 0x1000000 < alignment) {
    sVar2 = mi_usable_size(pvVar3);
    pvVar3 = memset(pvVar3,0,sVar2);
    return pvVar3;
  }
  return pvVar3;
}

Assistant:

static mi_decl_noinline void* mi_heap_malloc_zero_aligned_at_overalloc(mi_heap_t* const heap, const size_t size, const size_t alignment, const size_t offset, const bool zero) mi_attr_noexcept
{
  mi_assert_internal(size <= (MI_MAX_ALLOC_SIZE - MI_PADDING_SIZE));
  mi_assert_internal(alignment != 0 && _mi_is_power_of_two(alignment));

  void* p;
  size_t oversize;
  if mi_unlikely(alignment > MI_BLOCK_ALIGNMENT_MAX) {
    // use OS allocation for very large alignment and allocate inside a huge page (dedicated segment with 1 page)
    // This can support alignments >= MI_SEGMENT_SIZE by ensuring the object can be aligned at a point in the
    // first (and single) page such that the segment info is `MI_SEGMENT_SIZE` bytes before it (so it can be found by aligning the pointer down)
    if mi_unlikely(offset != 0) {
      // todo: cannot support offset alignment for very large alignments yet
#if MI_DEBUG > 0
      _mi_error_message(EOVERFLOW, "aligned allocation with a very large alignment cannot be used with an alignment offset (size %zu, alignment %zu, offset %zu)\n", size, alignment, offset);
#endif
      return NULL;
    }
    oversize = (size <= MI_SMALL_SIZE_MAX ? MI_SMALL_SIZE_MAX + 1 /* ensure we use generic malloc path */ : size);
    // note: no guarded as alignment > 0
    p = _mi_heap_malloc_zero_ex(heap, oversize, false, alignment); // the page block size should be large enough to align in the single huge page block
    // zero afterwards as only the area from the aligned_p may be committed!
    if (p == NULL) return NULL;
  }
  else {
    // otherwise over-allocate
    oversize = (size < MI_MAX_ALIGN_SIZE ? MI_MAX_ALIGN_SIZE : size) + alignment - 1;  // adjust for size <= 16; with size 0 and aligment 64k, we would allocate a 64k block and pointing just beyond that.
    p = mi_heap_malloc_zero_no_guarded(heap, oversize, zero);
    if (p == NULL) return NULL;
  }